

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::GraphicsRobustAccessPass::ProcessAFunction
          (GraphicsRobustAccessPass *this,Function *function)

{
  char cVar1;
  byte bVar2;
  BasicBlock *pBVar3;
  undefined8 *puVar4;
  byte bVar5;
  Instruction *inst;
  Instruction *pIVar6;
  vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *this_00;
  pointer puVar7;
  uint uVar8;
  vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *unaff_R14;
  undefined8 *puVar9;
  bool bVar10;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> access_chains;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  image_texel_pointers;
  Instruction *local_70;
  undefined8 *local_68;
  undefined8 *puStack_60;
  long local_58;
  pointer local_50;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_68 = (undefined8 *)0x0;
  puStack_60 = (undefined8 *)0x0;
  local_58 = 0;
  local_38 = 0;
  local_48 = (void *)0x0;
  uStack_40 = 0;
  puVar7 = (function->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (function->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != local_50) {
    unaff_R14 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                &local_68;
    do {
      pBVar3 = (puVar7->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      for (pIVar6 = *(Instruction **)
                     ((long)&(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10
                     );
          pIVar6 != (Instruction *)
                    ((long)&(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
          pIVar6 = (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        this_00 = unaff_R14;
        if ((pIVar6->opcode_ - OpAccessChain < 2) ||
           (this_00 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                       *)&local_48, pIVar6->opcode_ == OpImageTexelPointer)) {
          local_70 = pIVar6;
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          emplace_back<spvtools::opt::Instruction*>(this_00,&local_70);
        }
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != local_50);
  }
  puVar4 = puStack_60;
  puVar9 = local_68;
  bVar5 = (byte)unaff_R14;
  bVar10 = local_68 == puStack_60;
  if (!bVar10) {
    ClampIndicesForAccessChain(this,(Instruction *)*local_68);
    bVar5 = (this->super_Pass).field_0x34;
    uVar8 = (uint)bVar5;
    if ((this->super_Pass).field_0x35 == '\0') {
      do {
        bVar5 = (byte)uVar8;
        puVar9 = puVar9 + 1;
        bVar10 = puVar9 == puVar4;
        if (bVar10) break;
        ClampIndicesForAccessChain(this,(Instruction *)*puVar9);
        cVar1 = (this->super_Pass).field_0x35;
        if (cVar1 == '\0') {
          uVar8 = uVar8 & 0xff;
        }
        else {
          uVar8 = *(uint *)&(this->super_Pass).field_0x34;
        }
        bVar5 = (byte)uVar8;
      } while (cVar1 != '\x01');
    }
  }
  bVar2 = (this->super_Pass).field_0x34;
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  if (local_68 != (undefined8 *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  if (bVar10) {
    bVar5 = bVar2;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool GraphicsRobustAccessPass::ProcessAFunction(opt::Function* function) {
  // Ensure that all pointers computed inside a function are within bounds.
  // Find the access chains in this block before trying to modify them.
  std::vector<Instruction*> access_chains;
  std::vector<Instruction*> image_texel_pointers;
  for (auto& block : *function) {
    for (auto& inst : block) {
      switch (inst.opcode()) {
        case spv::Op::OpAccessChain:
        case spv::Op::OpInBoundsAccessChain:
          access_chains.push_back(&inst);
          break;
        case spv::Op::OpImageTexelPointer:
          image_texel_pointers.push_back(&inst);
          break;
        default:
          break;
      }
    }
  }
  for (auto* inst : access_chains) {
    ClampIndicesForAccessChain(inst);
    if (module_status_.failed) return module_status_.modified;
  }

  for (auto* inst : image_texel_pointers) {
    if (SPV_SUCCESS != ClampCoordinateForImageTexelPointer(inst)) break;
  }
  return module_status_.modified;
}